

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v64_intrinsics_c.h
# Opt level: O1

c_v64 simd_test_avx2::c_imm_v64_shr_n_u8<5>(c_v64 a)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  
  auVar2[8] = 7;
  auVar2._0_8_ = 0x707070707070707;
  auVar2[9] = 7;
  auVar2[10] = 7;
  auVar2[0xb] = 7;
  auVar2[0xc] = 7;
  auVar2[0xd] = 7;
  auVar2[0xe] = 7;
  auVar2[0xf] = 7;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = a.u64;
  auVar1 = vpsrlw_avx(auVar1,5);
  auVar1 = vpand_avx(auVar1,auVar2);
  return (c_v64)auVar1._0_8_;
}

Assistant:

SIMD_INLINE c_v64 c_v64_shr_u8(c_v64 a, unsigned int n) {
  c_v64 t;
  int c;
  if (SIMD_CHECK && n > 7) {
    fprintf(stderr, "Error: Undefined u8 shift right %d\n", n);
    abort();
  }
  for (c = 0; c < 8; c++) t.u8[c] = a.u8[c] >> n;
  return t;
}